

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

EnumValueOptions * __thiscall
google::protobuf::DescriptorPool::Tables::AllocateMessage<google::protobuf::EnumValueOptions>
          (Tables *this,EnumValueOptions *param_1)

{
  EnumValueOptions *this_00;
  EnumValueOptions *result;
  
  this_00 = (EnumValueOptions *)operator_new(0x50);
  EnumValueOptions::EnumValueOptions(this_00);
  result = this_00;
  std::
  vector<std::unique_ptr<google::protobuf::Message,std::default_delete<google::protobuf::Message>>,std::allocator<std::unique_ptr<google::protobuf::Message,std::default_delete<google::protobuf::Message>>>>
  ::emplace_back<google::protobuf::EnumValueOptions*&>
            ((vector<std::unique_ptr<google::protobuf::Message,std::default_delete<google::protobuf::Message>>,std::allocator<std::unique_ptr<google::protobuf::Message,std::default_delete<google::protobuf::Message>>>>
              *)&this->messages_,&result);
  return result;
}

Assistant:

Type* DescriptorPool::Tables::AllocateMessage(Type* /* dummy */) {
  Type* result = new Type;
  messages_.emplace_back(result);
  return result;
}